

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void google::protobuf::compiler::cpp::anon_unknown_9::CollectMacroNames
               (Descriptor *message,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  if (0 < *(int *)(message + 0x2c)) {
    lVar5 = 0;
    do {
      lVar6 = *(long *)(message + 0x30);
      pcVar1 = *(char **)(lVar6 + lVar5 * 0xa8);
      iVar4 = std::__cxx11::string::compare(pcVar1);
      if (iVar4 == 0) {
LAB_0024fc2a:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(names,*(value_type **)(lVar6 + lVar5 * 0xa8));
      }
      else {
        bVar3 = true;
        do {
          bVar2 = bVar3;
          if (!bVar2) goto LAB_0024fc3a;
          iVar4 = std::__cxx11::string::compare(pcVar1);
          bVar3 = false;
        } while (iVar4 != 0);
        if (bVar2) goto LAB_0024fc2a;
      }
LAB_0024fc3a:
      lVar5 = lVar5 + 1;
    } while (lVar5 < *(int *)(message + 0x2c));
  }
  if (0 < *(int *)(message + 0x48)) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      CollectMacroNames((Descriptor *)(*(long *)(message + 0x50) + lVar5),names);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0xa8;
    } while (lVar6 < *(int *)(message + 0x48));
  }
  return;
}

Assistant:

void CollectMacroNames(const Descriptor* message, std::vector<string>* names) {
  for (int i = 0; i < message->field_count(); ++i) {
    const FieldDescriptor* field = message->field(i);
    if (IsMacroName(field->name())) {
      names->push_back(field->name());
    }
  }
  for (int i = 0; i < message->nested_type_count(); ++i) {
    CollectMacroNames(message->nested_type(i), names);
  }
}